

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O1

void AES_setup(AES_state *rounds,uint8_t *key,int nkeywords,int nrounds)

{
  uint uVar1;
  int b_1;
  uint uVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  ushort uVar9;
  int i;
  long lVar10;
  uint uVar11;
  uint16_t top;
  ushort uVar12;
  uint uVar13;
  int b_2;
  uint uVar14;
  AES_state rcon;
  AES_state column;
  ushort local_78;
  undefined1 auStack_76 [4];
  ushort uStack_72;
  undefined8 uStack_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  uint local_4c;
  AES_state local_48;
  AES_state *local_38;
  
  local_58 = CONCAT44(in_register_00000014,nkeywords);
  _local_78 = 1;
  uStack_70 = 0;
  if (-1 < nrounds) {
    memset(rounds,0,(ulong)(uint)nrounds * 0x10 + 0x10);
  }
  iVar5 = (int)local_58;
  if (0 < iVar5) {
    uVar3 = 0;
    do {
      iVar6 = 0;
      do {
        bVar7 = *key;
        lVar10 = 0;
        do {
          rounds->slice[(uVar3 & 0xfffffffffffffffc) * 2 + lVar10] =
               rounds->slice[(uVar3 & 0xfffffffffffffffc) * 2 + lVar10] |
               (ushort)(bVar7 & 1) << (((byte)uVar3 & 3) + (char)iVar6 * '\x04' & 0x1f);
          bVar7 = bVar7 >> 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        key = key + 1;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 4);
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 != iVar5);
  }
  lVar10 = 0;
  do {
    local_48.slice[lVar10] =
         rounds[iVar5 - 1U >> 2].slice[lVar10] >> ((byte)(iVar5 - 1U) & 3) & 0x1111;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  local_4c = nrounds * 4 + 4;
  if (iVar5 < (int)local_4c) {
    local_5c = (uint)local_78;
    uVar4 = (uint)(ushort)auStack_76._0_2_;
    uVar13 = (uint)uStack_70._6_2_;
    uVar8 = (uint)uStack_70._2_2_;
    local_60 = (uint)uStack_72;
    local_64 = (uint)(ushort)auStack_76._2_2_;
    iVar5 = 0;
    uVar3 = local_58 & 0xffffffff;
    uVar9 = uStack_70._4_2_;
    uVar14 = (uint)(ushort)uStack_70;
    local_38 = rounds;
    do {
      if (iVar5 == 0) {
        SubBytes(&local_48,0);
        lVar10 = 0;
        do {
          local_48.slice[lVar10] =
               (local_48.slice[lVar10] << 0xc | local_48.slice[lVar10] >> 4) ^ (&local_78)[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        uVar11 = (uint)uVar9;
        uVar2 = local_60 ^ uVar13;
        uStack_70 = CONCAT62(CONCAT42(CONCAT22(uVar9,(ushort)uVar8),(short)uVar14),(short)uVar2);
        local_60 = local_64 ^ uVar13;
        _local_78 = CONCAT62(CONCAT42(CONCAT22((short)local_60,(short)uVar4),
                                      (short)(local_5c ^ uVar13)),(short)uVar13);
        uVar9 = (ushort)uVar8;
        uVar1 = local_5c ^ uVar13;
        local_64 = uVar4;
        local_5c = uVar13;
        uVar8 = uVar14;
      }
      else {
        uVar2 = uVar14;
        uVar11 = uVar13;
        uVar1 = uVar4;
        if (iVar5 == 4 && 6 < (int)local_58) {
          SubBytes(&local_48,0);
          uVar8 = uVar8 & 0xffff;
        }
      }
      uVar4 = uVar1;
      uVar13 = uVar11;
      iVar5 = iVar5 + 1;
      iVar6 = (int)uVar3;
      lVar10 = 0;
      do {
        uVar12 = local_38[iVar6 - (int)local_58 >> 2].slice[lVar10] >>
                 ((byte)(iVar6 - (int)local_58) & 3) & 0x1111 ^ local_48.slice[lVar10];
        local_48.slice[lVar10] = uVar12;
        local_38[iVar6 >> 2].slice[lVar10] =
             local_38[iVar6 >> 2].slice[lVar10] | (ushort)((uVar12 & 0x1111) << ((byte)uVar3 & 3));
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      if (iVar5 == (int)local_58) {
        iVar5 = 0;
      }
      uVar3 = (ulong)(iVar6 + 1U);
      uVar14 = uVar2;
    } while (iVar6 + 1U != local_4c);
  }
  return;
}

Assistant:

static void AES_setup(AES_state* rounds, const uint8_t* key, int nkeywords, int nrounds)
{
    int i;

    /* The one-byte round constant */
    AES_state rcon = {{1,0,0,0,0,0,0,0}};
    /* The number of the word being generated, modulo nkeywords */
    int pos = 0;
    /* The column representing the word currently being processed */
    AES_state column;

    for (i = 0; i < nrounds + 1; i++) {
        int b;
        for (b = 0; b < 8; b++) {
            rounds[i].slice[b] = 0;
        }
    }

    /* The first nkeywords round columns are just taken from the key directly. */
    for (i = 0; i < nkeywords; i++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(&rounds[i >> 2], *(key++), r, i & 3);
        }
    }

    GetOneColumn(&column, &rounds[(nkeywords - 1) >> 2], (nkeywords - 1) & 3);

    for (i = nkeywords; i < 4 * (nrounds + 1); i++) {
        /* Transform column */
        if (pos == 0) {
            SubBytes(&column, 0);
            KeySetupTransform(&column, &rcon);
            MultX(&rcon);
        } else if (nkeywords > 6 && pos == 4) {
            SubBytes(&column, 0);
        }
        if (++pos == nkeywords) pos = 0;
        KeySetupColumnMix(&column, &rounds[i >> 2], &rounds[(i - nkeywords) >> 2], i & 3, (i - nkeywords) & 3);
    }
}